

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O0

uint crnlib::utils::compute_max_mips(uint width,uint height)

{
  uint local_18;
  uint local_14;
  uint num_mips;
  uint height_local;
  uint width_local;
  
  if (width == 0 && height == 0) {
    height_local = 0;
  }
  else {
    local_18 = 1;
    local_14 = height;
    for (num_mips = width; 1 < num_mips || 1 < local_14; num_mips = num_mips >> 1) {
      local_14 = local_14 >> 1;
      local_18 = local_18 + 1;
    }
    height_local = local_18;
  }
  return height_local;
}

Assistant:

uint compute_max_mips(uint width, uint height)
        {
            if ((width | height) == 0)
            {
                return 0;
            }

            uint num_mips = 1;

            while ((width > 1U) || (height > 1U))
            {
                width >>= 1U;
                height >>= 1U;
                num_mips++;
            }

            return num_mips;
        }